

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApproxCheck.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_31ee::ApproxCheck::runOnFunction(ApproxCheck *this,Function *F)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  *pmVar1;
  Instruction *instr;
  ApproxCheck *this_00;
  Value *a;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  raw_ostream *prVar6;
  Function *pFVar7;
  char *pcVar8;
  pointer ppVVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  long lVar12;
  _Rb_tree_node_base *p_Var13;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *in_RCX;
  Function *pFVar14;
  pointer ppVVar15;
  Function *pFVar16;
  pointer ppIVar17;
  ApproxCheck *pAVar18;
  Instruction *I;
  _Self __tmp;
  StringRef Str;
  StringRef SVar19;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef SVar20;
  undefined1 auVar21 [16];
  string opcode;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> history;
  key_type local_b0;
  ApproxCheck *local_90;
  Function *local_88;
  Function *local_80;
  void *local_78;
  undefined8 uStack_70;
  long local_68;
  Function *local_58;
  _Base_ptr local_50;
  vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> local_48;
  
  prVar6 = (raw_ostream *)llvm::errs();
  SVar19.Length = 0x14;
  SVar19.Data = "\n===================";
  prVar6 = llvm::raw_ostream::operator<<(prVar6,SVar19);
  Str.Length = 9;
  Str.Data = "Function ";
  prVar6 = llvm::raw_ostream::operator<<(prVar6,Str);
  SVar19 = (StringRef)llvm::Value::getName();
  prVar6 = llvm::raw_ostream::operator<<(prVar6,SVar19);
  Str_00.Length = 0x15;
  Str_00.Data = "===================\n\n";
  llvm::raw_ostream::operator<<(prVar6,Str_00);
  local_80 = F + 0x48;
  pFVar14 = *(Function **)(F + 0x50);
  if (pFVar14 == local_80) {
    pFVar16 = (Function *)0x0;
  }
  else {
    do {
      pFVar7 = pFVar14 + -0x18;
      if (pFVar14 == (Function *)0x0) {
        pFVar7 = (Function *)0x0;
      }
      pFVar16 = *(Function **)(pFVar7 + 0x30);
    } while ((pFVar16 == pFVar7 + 0x28) &&
            (pFVar14 = *(Function **)(pFVar14 + 8), pFVar14 != local_80));
  }
  local_88 = F;
  if (pFVar14 != local_80) {
    do {
      local_b0._M_dataplus._M_p = (pointer)(pFVar16 + -0x18);
      if (pFVar16 == (Function *)0x0) {
        local_b0._M_dataplus._M_p = (pointer)0x0;
      }
      std::vector<llvm::Instruction*,std::allocator<llvm::Instruction*>>::
      emplace_back<llvm::Instruction*>
                ((vector<llvm::Instruction*,std::allocator<llvm::Instruction*>> *)&this->worklist,
                 (Instruction **)&local_b0);
      pFVar16 = *(Function **)(pFVar16 + 8);
      pFVar7 = pFVar14 + -0x18;
      if (pFVar14 == (Function *)0x0) {
        pFVar7 = (Function *)0x0;
      }
      while ((pFVar16 == pFVar7 + 0x28 &&
             (pFVar14 = *(Function **)(pFVar14 + 8), pFVar14 != local_80))) {
        pFVar7 = pFVar14 + -0x18;
        if (pFVar14 == (Function *)0x0) {
          pFVar7 = (Function *)0x0;
        }
        pFVar16 = *(Function **)(pFVar7 + 0x30);
      }
    } while (pFVar14 != local_80);
  }
  ppIVar17 = (this->worklist).
             super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = this;
  if (ppIVar17 !=
      (this->worklist).super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      instr = *ppIVar17;
      pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)instr[0x10] - 0x1b);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
      cVar3 = llvm::Instruction::mayReadFromMemory();
      if ((((cVar3 != '\0') || (cVar3 = llvm::Instruction::mayWriteToMemory(), cVar3 != '\0')) ||
          (iVar5 = std::__cxx11::string::compare((char *)&local_b0), iVar5 == 0)) ||
         (iVar5 = std::__cxx11::string::compare((char *)&local_b0), iVar5 == 0)) {
        local_78 = (void *)0x0;
        uStack_70 = 0;
        local_68 = 0;
        std::vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>::vector
                  (&local_48,
                   (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)&local_78);
        in_RCX = &local_48;
        checkUseChain(local_90,instr,1,&local_48);
        if (local_48.super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.
                          super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78 != (void *)0x0) {
          operator_delete(local_78,local_68 - (long)local_78);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      ppIVar17 = ppIVar17 + 1;
    } while (ppIVar17 !=
             (local_90->worklist).
             super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pAVar18 = local_90;
  ppVVar15 = (local_90->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar9 = (local_90->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppVVar15 < ppVVar9) {
    do {
      prVar6 = (raw_ostream *)llvm::errs();
      llvm::Value::print((raw_ostream *)*ppVVar15,SUB81(prVar6,0));
      Str_01.Length = 1;
      Str_01.Data = "\n";
      llvm::raw_ostream::operator<<(prVar6,Str_01);
      ppVVar15 = ppVVar15 + 1;
      ppVVar9 = (pAVar18->addrList).
                super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (ppVVar15 < ppVVar9);
    ppVVar15 = (pAVar18->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppVVar15 < ppVVar9) {
    do {
      this_00 = (ApproxCheck *)*ppVVar15;
      useAsData(pAVar18,(Value *)this_00,1);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0);
      if (0x1a < (byte)this_00->field_0x10) {
        in_RCX = (vector<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_> *)
                 llvm::Instruction::getOpcodeName((byte)this_00->field_0x10 - 0x1b);
        sVar2 = local_b0._M_string_length;
        strlen((char *)in_RCX);
        std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)sVar2,(ulong)in_RCX);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar5 != 0) {
        for (ppIVar17 = (local_90->worklist).
                        super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppIVar17 !=
            (local_90->worklist).
            super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppIVar17 = ppIVar17 + 1) {
          a = (Value *)*ppIVar17;
          bVar4 = hasSameOperands(this_00,a,(Value *)0x0,SUB81(in_RCX,0));
          if (bVar4) {
            useAsData(local_90,a,1);
          }
        }
      }
      pAVar18 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      ppVVar15 = ppVVar15 + 1;
    } while (ppVVar15 <
             (pAVar18->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pFVar14 = *(Function **)(local_88 + 0x50);
  if (pFVar14 != local_80) {
    pmVar1 = &local_90->opCounter;
    local_50 = &(local_90->opCounter)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_88 = pFVar14 + -0x18;
      if (pFVar14 == (Function *)0x0) {
        local_88 = (Function *)0x0;
      }
      pFVar16 = *(Function **)(local_88 + 0x30);
      local_88 = local_88 + 0x28;
      local_58 = pFVar14;
      if (pFVar16 != local_88) {
        do {
          pFVar14 = pFVar16 + -0x18;
          if (pFVar16 == (Function *)0x0) {
            pFVar14 = (Function *)0x0;
          }
          pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)pFVar14[0x10] - 0x1b);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                   ::find(&pmVar1->_M_t,&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (iVar10._M_node == local_50) {
            pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)pFVar14[0x10] - 0x1b);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                      ::operator[](pmVar1,&local_b0);
            pmVar11->first = 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)pFVar14[0x10] - 0x1b);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                      ::operator[](pmVar1,&local_b0);
            pmVar11->second = 0;
          }
          else {
            pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)pFVar14[0x10] - 0x1b);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                      ::operator[](pmVar1,&local_b0);
            pmVar11->first = pmVar11->first + 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (((*(long *)(pFVar14 + 0x30) == 0) && ((*(uint *)(pFVar14 + 0x14) & 0x20000000) == 0))
             || (SVar20.Length = (size_t)"approx", SVar20.Data = (char *)pFVar14,
                lVar12 = llvm::Instruction::getMetadataImpl(SVar20), lVar12 == 0)) {
LAB_00103c39:
            pcVar8 = (char *)llvm::Instruction::getOpcodeName((byte)pFVar14[0x10] - 0x1b);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,pcVar8,(allocator<char> *)&local_78);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
                      ::operator[](pmVar1,&local_b0);
            pmVar11->second = pmVar11->second + 1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            if ((ulong)*(uint *)(lVar12 + 8) == 0) {
              __assert_fail("I < NumOperands && \"Out of range\"",
                            "/usr/lib/llvm-14/include/llvm/IR/Metadata.h",0x485,
                            "const MDOperand &llvm::MDNode::getOperand(unsigned int) const");
            }
            pcVar8 = *(char **)(lVar12 + (ulong)*(uint *)(lVar12 + 8) * -8);
            if (pcVar8 == (char *)0x0) {
              __assert_fail("Val && \"isa<> used on a null pointer\"",
                            "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x5a,
                            "static bool llvm::isa_impl_cl<llvm::MDString, llvm::Metadata *>::doit(const From *) [To = llvm::MDString, From = llvm::Metadata *]"
                           );
            }
            if (*pcVar8 != '\0') {
              __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                            "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0xff,
                            "std::enable_if_t<!is_simple_type<Y>::value, typename cast_retty<X, const Y>::ret_type> llvm::cast(const Y &) [X = llvm::MDString, Y = llvm::MDOperand]"
                           );
            }
            auVar21 = llvm::MDString::getString();
            if ((auVar21._8_8_ != 2) || (*auVar21._0_8_ != 0x6f6e)) goto LAB_00103c39;
          }
          pFVar16 = *(Function **)(pFVar16 + 8);
        } while (pFVar16 != local_88);
      }
      pFVar14 = *(Function **)(local_58 + 8);
    } while (pFVar14 != local_80);
  }
  pAVar18 = local_90;
  pmVar1 = &local_90->opCounter;
  for (p_Var13 = (local_90->opCounter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    pcVar8 = (char *)llvm::errs();
    prVar6 = (raw_ostream *)llvm::raw_ostream::write(pcVar8,*(ulong *)(p_Var13 + 1));
    Str_02.Length = 2;
    Str_02.Data = ": ";
    prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_02);
    prVar6 = (raw_ostream *)
             llvm::raw_ostream::operator<<(prVar6,(long)*(int *)&p_Var13[2].field_0x4);
    Str_03.Length = 1;
    Str_03.Data = "/";
    prVar6 = llvm::raw_ostream::operator<<(prVar6,Str_03);
    prVar6 = (raw_ostream *)llvm::raw_ostream::operator<<(prVar6,(long)(int)p_Var13[2]._M_color);
    Str_04.Length = 0x15;
    Str_04.Data = " can be approximated\n";
    llvm::raw_ostream::operator<<(prVar6,Str_04);
  }
  prVar6 = (raw_ostream *)llvm::errs();
  Str_05.Length = 1;
  Str_05.Data = "\n";
  llvm::raw_ostream::operator<<(prVar6,Str_05);
  ppIVar17 = (pAVar18->worklist).
             super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pAVar18->worklist).
      super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar17) {
    (pAVar18->worklist).
    super__Vector_base<llvm::Instruction_*,_std::allocator<llvm::Instruction_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppIVar17;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_int>_>_>_>
  ::clear(&(pAVar18->opCounter)._M_t);
  ppVVar15 = (pAVar18->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pAVar18->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar15) {
    (pAVar18->addrList).super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar15;
  }
  return false;
}

Assistant:

virtual bool runOnFunction(Function &F) {
			errs() << "\n===================" << "Function " << F.getName() << "===================\n\n";

			for (inst_iterator I = inst_begin(F), E = inst_end(F); I != E; ++I) {
				worklist.push_back(&*I);
			}

			// Step 1) Find all places where an address is being used.
			// Step 2) If the address is stored in memory, locate the addresses that point to those memory locations.
			for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
				Instruction* instr = *i;
				std::string opcode = instr->getOpcodeName();
				if (instr->mayReadOrWriteMemory() || opcode == "br" || opcode == "ret") {
					// errs() << "(0)" << *instr << "\n";
					std::vector<Instruction*> history;
					checkUseChain(instr, 1, history);
				}
			}

			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				errs() << **i << "\n";
			}

			// Step 3) Find all places where the address is being operated on.
			for (std::vector<Value*>::iterator i = addrList.begin(); i < addrList.end(); i++) {
				Value* v = *i;
				useAsData(v, 1);

				// alloca is a special case. We do not want to let it check against all local variables of the same type.
				std::string newopcode = "";
				if (isa<Instruction>(v)) {
					Instruction *I = dyn_cast<Instruction>(v);
					newopcode = I->getOpcodeName();
				}

				if (newopcode != "alloca") {
					for(std::vector<Instruction*>::iterator i = worklist.begin(); i != worklist.end(); i++) {
						Value* instr = *i;
						if (hasSameOperands(v, instr, false)) {
							// errs() << "(0)" << *instr << "\n";
							useAsData(instr, 1);
						}
					}
				}
			}

			countOpcodes(F);

			// Print approx counts
			std::map <std::string, std::pair<int, int>>::iterator i = opCounter.begin();
			while (i != opCounter.end()) {
				errs() << i->first << ": " << i->second.second << "/" << i->second.first << " can be approximated\n";
				i++;
			}
			errs() << "\n";


			worklist.clear();
			opCounter.clear();
			addrList.clear();
			return false;
		}